

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::Clipper::IntersectEdges
          (Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt,IntersectProtects protects)

{
  PolyType PVar1;
  uint uVar2;
  uint uVar3;
  PolyFillType PVar4;
  PolyFillType PVar5;
  PolyType PVar6;
  uint uVar7;
  EdgeSide EVar8;
  TEdge *pTVar9;
  PolyFillType PVar10;
  PolyFillType PVar11;
  PolyFillType PVar12;
  int oldE1WindCnt;
  ulong uVar13;
  TEdge **ppTVar14;
  int iVar15;
  int iVar16;
  TEdge *pTVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  
  if ((((protects & ipLeft) == ipNone) && (e1->nextInLML == (TEdge *)0x0)) && (e1->xtop == pt->X)) {
    bVar21 = e1->ytop == pt->Y;
  }
  else {
    bVar21 = false;
  }
  if ((((protects & ipRight) == ipNone) && (e2->nextInLML == (TEdge *)0x0)) && (e2->xtop == pt->X))
  {
    bVar22 = e2->ytop == pt->Y;
  }
  else {
    bVar22 = false;
  }
  PVar1 = e1->polyType;
  uVar2 = e1->outIdx;
  uVar3 = e2->outIdx;
  if (PVar1 == e2->polyType) {
    iVar16 = e1->windCnt;
    if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
      e1->windCnt = e2->windCnt;
    }
    else {
      iVar15 = e2->windDelta + iVar16;
      iVar16 = -iVar16;
      if (iVar15 != 0) {
        iVar16 = iVar15;
      }
      e1->windCnt = iVar16;
      iVar16 = e2->windCnt - e1->windDelta;
      if (iVar16 != 0) {
        e2->windCnt = iVar16;
        goto LAB_0067f145;
      }
      iVar16 = -e2->windCnt;
    }
    e2->windCnt = iVar16;
  }
  else {
    if ((&this->m_ClipFillType)[e2->polyType == ptSubject] == pftEvenOdd) {
      e1->windCnt2 = (uint)(e1->windCnt2 == 0);
    }
    else {
      e1->windCnt2 = e1->windCnt2 + e2->windDelta;
    }
    if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
      e2->windCnt2 = (uint)(e2->windCnt2 == 0);
    }
    else {
      e2->windCnt2 = e2->windCnt2 - e1->windDelta;
    }
  }
LAB_0067f145:
  PVar1 = e1->polyType;
  PVar4 = this->m_ClipFillType;
  PVar5 = this->m_SubjFillType;
  PVar10 = PVar4;
  PVar12 = PVar5;
  if (PVar1 == ptSubject) {
    PVar10 = PVar5;
    PVar12 = PVar4;
  }
  PVar6 = e2->polyType;
  PVar11 = PVar4;
  if (PVar6 == ptSubject) {
    PVar11 = PVar5;
    PVar5 = PVar4;
  }
  uVar7 = e1->windCnt;
  uVar19 = (ulong)(int)uVar7;
  if (PVar10 == pftNegative) {
    uVar19 = (ulong)(int)-uVar7;
  }
  else if (PVar10 != pftPositive) {
    if ((int)uVar7 < 1) {
      uVar7 = -uVar7;
    }
    uVar19 = (ulong)uVar7;
  }
  uVar7 = e2->windCnt;
  uVar20 = (ulong)(int)uVar7;
  if (PVar11 == pftNegative) {
    uVar20 = (ulong)(int)-uVar7;
  }
  else if (PVar11 != pftPositive) {
    if ((int)uVar7 < 1) {
      uVar7 = -uVar7;
    }
    uVar20 = (ulong)uVar7;
  }
  if (-1 < (int)(uVar2 | uVar3)) {
    if (((bVar21 == false && bVar22 == false) && (uVar19 < 2)) &&
       ((uVar20 < 2 && ((PVar1 == PVar6 || (this->m_ClipType == ctXor)))))) {
      DoBothEdges(this,e1,e2,pt);
    }
    else {
      AddLocalMaxPoly(this,e1,e2,pt);
    }
    goto switchD_0067f311_default;
  }
  if ((int)uVar2 < 0) {
    if ((int)uVar3 < 0) {
      if ((1 < uVar19) || ((bVar21 != false || bVar22 != false) || 1 < uVar20))
      goto switchD_0067f311_default;
      uVar2 = e1->windCnt2;
      uVar13 = (ulong)(int)uVar2;
      if (PVar12 == pftNegative) {
        uVar13 = (ulong)(int)-uVar2;
      }
      else if (PVar12 != pftPositive) {
        if ((int)uVar2 < 1) {
          uVar2 = -uVar2;
        }
        uVar13 = (ulong)uVar2;
      }
      uVar2 = e2->windCnt2;
      uVar18 = (ulong)(int)uVar2;
      if (PVar5 == pftNegative) {
        uVar18 = (ulong)(int)-uVar2;
      }
      else if (PVar5 != pftPositive) {
        if ((int)uVar2 < 1) {
          uVar2 = -uVar2;
        }
        uVar18 = (ulong)uVar2;
      }
      if (PVar1 != PVar6) goto switchD_0067f311_caseD_3;
      if ((uVar19 != 1) || (uVar20 != 1)) {
        EVar8 = e1->side;
        e1->side = e2->side;
        e2->side = EVar8;
        goto switchD_0067f311_default;
      }
      switch(this->m_ClipType) {
      case ctIntersection:
        if (((long)uVar13 < 1) || ((long)uVar18 < 1)) goto switchD_0067f311_default;
        break;
      case ctUnion:
switchD_0067f311_caseD_1:
        if ((0 < (long)uVar13) || (0 < (long)uVar18)) goto switchD_0067f311_default;
        break;
      case ctDifference:
        if (((PVar1 != ptClip) || ((long)uVar13 < 1)) || ((long)uVar18 < 1)) {
          if (PVar1 != ptSubject) goto switchD_0067f311_default;
          goto switchD_0067f311_caseD_1;
        }
        break;
      case ctXor:
        break;
      default:
        goto switchD_0067f311_default;
      }
switchD_0067f311_caseD_3:
      AddLocalMinPoly(this,e1,e2,pt);
      goto switchD_0067f311_default;
    }
    if (1 < uVar19) goto switchD_0067f311_default;
    pTVar17 = e2;
    if ((PVar1 != ptSubject) && (this->m_ClipType == ctIntersection)) {
      iVar16 = e1->windCnt2;
      goto joined_r0x0067f23e;
    }
  }
  else {
    if (1 < uVar20) goto switchD_0067f311_default;
    pTVar17 = e1;
    if ((PVar6 != ptSubject) && (this->m_ClipType == ctIntersection)) {
      iVar16 = e2->windCnt2;
joined_r0x0067f23e:
      if (iVar16 == 0) goto switchD_0067f311_default;
    }
  }
  AddOutPt(this,pTVar17,pt);
  EVar8 = e1->side;
  e1->side = e2->side;
  e2->side = EVar8;
  iVar16 = e1->outIdx;
  e1->outIdx = e2->outIdx;
  e2->outIdx = iVar16;
switchD_0067f311_default:
  if ((bVar21 != bVar22) &&
     (((bVar21 != false && (-1 < e1->outIdx)) || ((bVar22 != false && (-1 < e2->outIdx)))))) {
    EVar8 = e1->side;
    e1->side = e2->side;
    e2->side = EVar8;
    iVar16 = e1->outIdx;
    e1->outIdx = e2->outIdx;
    e2->outIdx = iVar16;
  }
  if (bVar21 != false) {
    pTVar17 = e1->nextInAEL;
    pTVar9 = e1->prevInAEL;
    if (((pTVar9 != (TEdge *)0x0) || (pTVar17 != (TEdge *)0x0)) || (this->m_ActiveEdges == e1)) {
      ppTVar14 = &this->m_ActiveEdges;
      if (pTVar9 != (TEdge *)0x0) {
        ppTVar14 = &pTVar9->nextInAEL;
      }
      *ppTVar14 = pTVar17;
      if (pTVar17 != (TEdge *)0x0) {
        pTVar17->prevInAEL = pTVar9;
      }
      e1->nextInAEL = (TEdge *)0x0;
      e1->prevInAEL = (TEdge *)0x0;
    }
  }
  if (bVar22 != false) {
    pTVar17 = e2->nextInAEL;
    pTVar9 = e2->prevInAEL;
    if (((pTVar9 != (TEdge *)0x0) || (pTVar17 != (TEdge *)0x0)) || (this->m_ActiveEdges == e2)) {
      ppTVar14 = &pTVar9->nextInAEL;
      if (pTVar9 == (TEdge *)0x0) {
        ppTVar14 = &this->m_ActiveEdges;
      }
      *ppTVar14 = pTVar17;
      if (pTVar17 != (TEdge *)0x0) {
        pTVar17->prevInAEL = pTVar9;
      }
      e2->nextInAEL = (TEdge *)0x0;
      e2->prevInAEL = (TEdge *)0x0;
    }
  }
  return;
}

Assistant:

void Clipper::IntersectEdges(TEdge *e1, TEdge *e2,
     const IntPoint &pt, IntersectProtects protects)
{
  //e1 will be to the left of e2 BELOW the intersection. Therefore e1 is before
  //e2 in AEL except when e1 is being inserted at the intersection point ...
  bool e1stops = !(ipLeft & protects) &&  !e1->nextInLML &&
    e1->xtop == pt.X && e1->ytop == pt.Y;
  bool e2stops = !(ipRight & protects) &&  !e2->nextInLML &&
    e2->xtop == pt.X && e2->ytop == pt.Y;
  bool e1Contributing = ( e1->outIdx >= 0 );
  bool e2contributing = ( e2->outIdx >= 0 );

  //update winding counts...
  //assumes that e1 will be to the right of e2 ABOVE the intersection
  if ( e1->polyType == e2->polyType )
  {
    if ( IsEvenOddFillType( *e1) )
    {
      int oldE1WindCnt = e1->windCnt;
      e1->windCnt = e2->windCnt;
      e2->windCnt = oldE1WindCnt;
    } else
    {
      if (e1->windCnt + e2->windDelta == 0 ) e1->windCnt = -e1->windCnt;
      else e1->windCnt += e2->windDelta;
      if ( e2->windCnt - e1->windDelta == 0 ) e2->windCnt = -e2->windCnt;
      else e2->windCnt -= e1->windDelta;
    }
  } else
  {
    if (!IsEvenOddFillType(*e2)) e1->windCnt2 += e2->windDelta;
    else e1->windCnt2 = ( e1->windCnt2 == 0 ) ? 1 : 0;
    if (!IsEvenOddFillType(*e1)) e2->windCnt2 -= e1->windDelta;
    else e2->windCnt2 = ( e2->windCnt2 == 0 ) ? 1 : 0;
  }

  PolyFillType e1FillType, e2FillType, e1FillType2, e2FillType2;
  if (e1->polyType == ptSubject)
  {
    e1FillType = m_SubjFillType;
    e1FillType2 = m_ClipFillType;
  } else
  {
    e1FillType = m_ClipFillType;
    e1FillType2 = m_SubjFillType;
  }
  if (e2->polyType == ptSubject)
  {
    e2FillType = m_SubjFillType;
    e2FillType2 = m_ClipFillType;
  } else
  {
    e2FillType = m_ClipFillType;
    e2FillType2 = m_SubjFillType;
  }

  long64 e1Wc, e2Wc;
  switch (e1FillType)
  {
    case pftPositive: e1Wc = e1->windCnt; break;
    case pftNegative: e1Wc = -e1->windCnt; break;
    default: e1Wc = Abs(e1->windCnt);
  }
  switch(e2FillType)
  {
    case pftPositive: e2Wc = e2->windCnt; break;
    case pftNegative: e2Wc = -e2->windCnt; break;
    default: e2Wc = Abs(e2->windCnt);
  }

  if ( e1Contributing && e2contributing )
  {
    if ( e1stops || e2stops || 
      (e1Wc != 0 && e1Wc != 1) || (e2Wc != 0 && e2Wc != 1) ||
      (e1->polyType != e2->polyType && m_ClipType != ctXor) )
        AddLocalMaxPoly(e1, e2, pt); 
    else
        DoBothEdges( e1, e2, pt );
  }
  else if ( e1Contributing )
  {
    if ((e2Wc == 0 || e2Wc == 1) && 
      (m_ClipType != ctIntersection || 
      e2->polyType == ptSubject || (e2->windCnt2 != 0))) 
        DoEdge1(e1, e2, pt);
  }
  else if ( e2contributing )
  {
    if ((e1Wc == 0 || e1Wc == 1) && 
      (m_ClipType != ctIntersection || 
      e1->polyType == ptSubject || (e1->windCnt2 != 0))) 
        DoEdge2(e1, e2, pt);
  } 
  else if ( (e1Wc == 0 || e1Wc == 1) && 
    (e2Wc == 0 || e2Wc == 1) && !e1stops && !e2stops )
  {
    //neither edge is currently contributing ...

    long64 e1Wc2, e2Wc2;
    switch (e1FillType2)
    {
      case pftPositive: e1Wc2 = e1->windCnt2; break;
      case pftNegative : e1Wc2 = -e1->windCnt2; break;
      default: e1Wc2 = Abs(e1->windCnt2);
    }
    switch (e2FillType2)
    {
      case pftPositive: e2Wc2 = e2->windCnt2; break;
      case pftNegative: e2Wc2 = -e2->windCnt2; break;
      default: e2Wc2 = Abs(e2->windCnt2);
    }

    if (e1->polyType != e2->polyType)
        AddLocalMinPoly(e1, e2, pt);
    else if (e1Wc == 1 && e2Wc == 1)
      switch( m_ClipType ) {
        case ctIntersection:
          if (e1Wc2 > 0 && e2Wc2 > 0)
            AddLocalMinPoly(e1, e2, pt);
          break;
        case ctUnion:
          if ( e1Wc2 <= 0 && e2Wc2 <= 0 )
            AddLocalMinPoly(e1, e2, pt);
          break;
        case ctDifference:
          if (((e1->polyType == ptClip) && (e1Wc2 > 0) && (e2Wc2 > 0)) ||
              ((e1->polyType == ptSubject) && (e1Wc2 <= 0) && (e2Wc2 <= 0)))
                AddLocalMinPoly(e1, e2, pt);
          break;
        case ctXor:
          AddLocalMinPoly(e1, e2, pt);
      }
    else
      SwapSides( *e1, *e2 );
  }

  if(  (e1stops != e2stops) &&
    ( (e1stops && (e1->outIdx >= 0)) || (e2stops && (e2->outIdx >= 0)) ) )
  {
    SwapSides( *e1, *e2 );
    SwapPolyIndexes( *e1, *e2 );
  }

  //finally, delete any non-contributing maxima edges  ...
  if( e1stops ) DeleteFromAEL( e1 );
  if( e2stops ) DeleteFromAEL( e2 );
}